

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestConflictingSymbolNames_Data1::Clear(TestConflictingSymbolNames_Data1 *this)

{
  anon_union_24_1_493b367e_for_TestConflictingSymbolNames_Data1_3 *this_00;
  anon_union_24_1_493b367e_for_TestConflictingSymbolNames_Data1_3 aVar1;
  int iVar2;
  bool is_soo;
  
  this_00 = &this->field_0;
  aVar1 = this->field_0;
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x4) != (undefined1  [24])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  is_soo = ((undefined1  [24])aVar1 & (undefined1  [24])0x4) == (undefined1  [24])0x0;
  google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,is_soo);
  iVar2 = google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,is_soo);
  if ((iVar2 != 0) &&
     ((undefined1  [24])((undefined1  [24])*this_00 & (undefined1  [24])0x4) !=
      (undefined1  [24])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_);
  }
  google::protobuf::RepeatedField<int>::set_size
            (&(this_00->_impl_).data_,
             ((undefined1  [24])aVar1 & (undefined1  [24])0x4) == (undefined1  [24])0x0,0);
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestConflictingSymbolNames_Data1::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestConflictingSymbolNames.Data1)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.data_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}